

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void draw_uniques(int *array,size_t length,int min,int max)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    if (length <= uVar4) {
      return;
    }
    iVar2 = rand();
    iVar2 = iVar2 % (max - min) + min;
    array[uVar4] = iVar2;
    uVar3 = 0;
    do {
      if (uVar4 == uVar3) {
        uVar4 = uVar4 + 1;
        break;
      }
      piVar1 = array + uVar3;
      uVar3 = uVar3 + 1;
    } while (*piVar1 != iVar2);
  } while( true );
}

Assistant:

void draw_uniques(int* array, const size_t length, const int min, const int max) {
  for (size_t n = 0; n < length; n++) {
    array[n] = rand() % (max - min) + min;
    for (size_t o = 0; o < n; o++) {
      if (array[o] == array[n]) {
        // Decrement and loop over
        n--;
        break;
      }
    }
  }
}